

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O2

uchar __thiscall
Wasm::WasmBinaryReader::LEB128<unsigned_char,7u>(WasmBinaryReader *this,uint32 *length)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  uint32 uVar4;
  uint uVar5;
  WasmBinaryReader *this_00;
  byte bVar6;
  byte bVar7;
  
  *length = 0;
  uVar4 = 0;
  uVar5 = 1;
  bVar3 = 0x80;
  bVar6 = 0;
  bVar7 = 0;
  this_00 = this;
  while (((uVar5 & 1) != 0 && ((char)bVar3 < '\0'))) {
    this_00 = this;
    CheckBytesLeft(this,1);
    pbVar1 = this->m_pc;
    this->m_pc = pbVar1 + 1;
    bVar3 = *pbVar1;
    bVar2 = bVar6 & 0x1f;
    bVar7 = bVar7 | (byte)((bVar3 & 0x7f) << bVar2);
    bVar6 = bVar6 + 7;
    uVar5 = 0 << bVar2;
    uVar4 = 1;
  }
  if (-1 < (char)bVar3) {
    *length = uVar4;
    return bVar7;
  }
  ThrowDecodingError(this_00,L"Invalid LEB128 format");
}

Assistant:

LEBType WasmBinaryReader::LEB128(uint32 &length)
{
    CompileAssert((sizeof(LEBType) * 8) >= bits);
    constexpr bool sign = LEBType(-1) < LEBType(0);
    LEBType result = 0;
    uint32 shift = 0;
    byte b = 0x80;
    length = 0;
    constexpr uint32 maxBytes = (uint32)((bits + 6) / 7);
    CompileAssert(maxBytes > 0);

    uint32 iByte = 0;
    for (; iByte < maxBytes && (b & 0x80) == 0x80; ++iByte)
    {
        CheckBytesLeft(1);
        b = *m_pc++;
        result = result | ((LEBType)(b & 0x7f) << shift);
        shift += 7;
    }

    if ((b & 0x80) == 0x80)
    {
        ThrowDecodingError(_u("Invalid LEB128 format"));
    }

    const bool isLastByte = iByte == maxBytes;
    constexpr bool hasExtraBits = (maxBytes * 7) != bits;
    if (hasExtraBits && isLastByte)
    {
        // A signed-LEB128 must sign-extend the final byte, excluding its most-significant bit
        // For unsigned values, the extra bits must be all zero.
        // For signed values, the extra bits *plus* the most significant bit must either be 0, or all ones.

        // e.g. for a 32-bit LEB128:
        //   bitsInLastByte = 4  (== 32 - (5-1) * 7)
        //     0bYYYXXXX where Y are extra bits and X are bits included in LEB128
        //   if signed: check if 0bYYYXXXX is 0b0000XXX or 0b1111XXX
        //   is unsigned: check if 0bYYYXXXX is 0b000XXXX

        constexpr int bitsInLastByte = bits - (maxBytes - 1) * 7;
        constexpr int lastBitToCheck = bitsInLastByte - (sign ? 1 : 0);
        constexpr byte signExtendedExtraBits = 0x7f & (0xFF << lastBitToCheck);
        const byte checkedBits = b & (0xFF << lastBitToCheck);
        bool validExtraBits =
            checkedBits == 0 ||
            (sign && checkedBits == signExtendedExtraBits);
        if (!validExtraBits)
        {
            ThrowDecodingError(_u("Invalid LEB128 format"));
        }
    }

    length = iByte;
    if (sign)
    {
        // Perform sign extension
        const int signExtendShift = (sizeof(LEBType) * 8) - shift;
        if (signExtendShift > 0)
        {
            result = static_cast<LEBType>(result << signExtendShift) >> signExtendShift;
        }
    }
    return result;
}